

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandMajExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint nNodes;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  
  local_48 = 0;
  Extra_UtilGetoptReset();
  nNodes = 1;
  local_3c = 3;
  local_4c = 0;
  bVar1 = false;
  local_38 = 0;
  local_40 = 0;
  local_44 = 1;
LAB_00226a36:
  while (iVar3 = Extra_UtilGetopt(argc,argv,"INRfcrgvh"), iVar2 = globalUtilOptind, iVar3 == 0x49) {
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-I\" should be followed by an integer.\n";
      goto LAB_00226b4f;
    }
    local_3c = atoi(argv[globalUtilOptind]);
    uVar4 = local_3c;
joined_r0x00226b06:
    globalUtilOptind = iVar2 + 1;
    if ((int)uVar4 < 0) {
LAB_00226b59:
      Abc_Print(-2,"usage: majexact [-INR <num>] [-fcrgvh]\n");
      Abc_Print(-2,"\t           exact synthesis of multi-input MAJ using MAJ3 gates\n");
      Abc_Print(-2,"\t-I <num> : the number of input variables [default = %d]\n",(ulong)local_3c);
      Abc_Print(-2,"\t-N <num> : the number of MAJ3 nodes [default = %d]\n",(ulong)nNodes);
      Abc_Print(-2,"\t-R <num> : the number of additional connections [default = %d]\n",
                (ulong)local_40);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_48 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-f       : toggle using constant fanins [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_4c == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-c       : toggle using cascade topology [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_38 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-r       : toggle using random topology [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (!bVar1) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n"
                ,pcVar5);
      if (local_44 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  }
  if (iVar3 == 0x4e) {
    if (globalUtilOptind < argc) {
      nNodes = atoi(argv[globalUtilOptind]);
      uVar4 = nNodes;
      goto joined_r0x00226b06;
    }
    pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
  }
  else {
    if (iVar3 != 0x52) {
      if (iVar3 == 99) {
        local_4c = local_4c ^ 1;
      }
      else if (iVar3 == 0x66) {
        local_48 = local_48 ^ 1;
      }
      else if (iVar3 == 0x67) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else if (iVar3 == 0x72) {
        local_38 = local_38 ^ 1;
      }
      else {
        if (iVar3 != 0x76) {
          if (iVar3 == -1) {
            if ((local_3c & 1) == 0) {
              Abc_Print(-1,"Cannot sythesize MAJ gate with an even number of inputs (%d).\n");
              return 1;
            }
            if (bVar1) {
              Maj_ManExactSynthesis(local_3c,nNodes,local_48,local_4c,local_44);
            }
            else {
              Maj_ManExactSynthesis2(local_3c,nNodes,local_48,local_4c,local_38,local_40,local_44);
            }
            return 0;
          }
          goto LAB_00226b59;
        }
        local_44 = local_44 ^ 1;
      }
      goto LAB_00226a36;
    }
    if (globalUtilOptind < argc) {
      local_40 = atoi(argv[globalUtilOptind]);
      uVar4 = local_40;
      goto joined_r0x00226b06;
    }
    pcVar5 = "Command line switch \"-R\" should be followed by an integer.\n";
  }
LAB_00226b4f:
  Abc_Print(-1,pcVar5);
  goto LAB_00226b59;
}

Assistant:

int Abc_CommandMajExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Maj_ManExactSynthesis( int nVars, int nNodes, int fUseConst, int fUseLine, int fVerbose );
    extern int Maj_ManExactSynthesis2( int nVars, int nNodes, int fUseConst, int fUseLine, int fUseRand, int nRands, int fVerbose );
    int c, nVars = 3, nNodes = 1, fUseConst = 0, fUseLine = 0, fGlucose = 0, fUseRand = 0, nRands = 0, fVerbose = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "INRfcrgvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVars < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodes < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nRands = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRands < 0 )
                goto usage;
            break;
        case 'f':
            fUseConst ^= 1;
            break;
        case 'c':
            fUseLine ^= 1;
            break;
        case 'r':
            fUseRand ^= 1;
            break;
        case 'g':
            fGlucose ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( (nVars & 1) == 0 )
    {
        Abc_Print( -1, "Cannot sythesize MAJ gate with an even number of inputs (%d).\n", nVars );
        return 1;
    }
    if ( fGlucose )
        Maj_ManExactSynthesis( nVars, nNodes, fUseConst, fUseLine, fVerbose );
    else
        Maj_ManExactSynthesis2( nVars, nNodes, fUseConst, fUseLine, fUseRand, nRands, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: majexact [-INR <num>] [-fcrgvh]\n" );
    Abc_Print( -2, "\t           exact synthesis of multi-input MAJ using MAJ3 gates\n" );
    Abc_Print( -2, "\t-I <num> : the number of input variables [default = %d]\n", nVars );
    Abc_Print( -2, "\t-N <num> : the number of MAJ3 nodes [default = %d]\n", nNodes );
    Abc_Print( -2, "\t-R <num> : the number of additional connections [default = %d]\n", nRands );
    Abc_Print( -2, "\t-f       : toggle using constant fanins [default = %s]\n", fUseConst ? "yes" : "no" );
    Abc_Print( -2, "\t-c       : toggle using cascade topology [default = %s]\n", fUseLine ? "yes" : "no" );
    Abc_Print( -2, "\t-r       : toggle using random topology [default = %s]\n", fUseRand ? "yes" : "no" );
    Abc_Print( -2, "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", fGlucose ? "yes" : "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    return 1;
}